

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

string * minja::error_location_suffix(string *source,size_t pos)

{
  difference_type dVar1;
  long lVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char __c;
  long in_RDX;
  string *in_RDI;
  ostringstream out;
  unsigned_long col;
  difference_type max_line;
  difference_type line;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  const_iterator end;
  const_iterator start;
  anon_class_8_1_6bb45959 get_line;
  difference_type in_stack_fffffffffffffcb0;
  allocator<char> *in_stack_fffffffffffffcb8;
  char *in_stack_fffffffffffffcc0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcc8;
  allocator<char> *__n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcd0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcd8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffce0;
  string local_2c8 [8];
  size_t in_stack_fffffffffffffd40;
  anon_class_8_1_6bb45959 *in_stack_fffffffffffffd48;
  allocator<char> local_2a1;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  ostringstream local_240 [399];
  allocator<char> local_b1;
  char *local_b0;
  undefined8 local_a8;
  string local_a0 [32];
  ulong local_80;
  undefined1 local_71;
  undefined8 local_70;
  undefined8 local_68;
  long local_60;
  undefined1 local_51;
  char *local_50;
  undefined8 local_48;
  long local_40;
  char *local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_18;
  
  local_18 = in_RDX;
  local_28 = std::__cxx11::string::begin();
  local_30 = std::__cxx11::string::end();
  local_50 = (char *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  local_48 = local_28;
  local_51 = 10;
  local_38 = local_50;
  dVar1 = std::count<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  local_40 = dVar1 + 1;
  local_68 = local_28;
  local_70 = local_30;
  local_71 = 10;
  dVar1 = std::count<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  local_60 = dVar1 + 1;
  local_a8 = local_28;
  local_b0 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd0._M_current,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffcd8,(allocator<char> *)in_stack_fffffffffffffcc8._M_current);
  lVar2 = std::__cxx11::string::rfind((char)local_a0,10);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_b1);
  local_80 = local_18 - lVar2;
  std::__cxx11::ostringstream::ostringstream(local_240);
  poVar3 = std::operator<<((ostream *)local_240," at row ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_40);
  poVar3 = std::operator<<(poVar3,", column ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_80);
  std::operator<<(poVar3,":\n");
  if (1 < local_40) {
    error_location_suffix(std::__cxx11::string_const&,unsigned_long)::$_0::operator()[abi_cxx11_
              (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    poVar3 = std::operator<<((ostream *)local_240,local_260);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_260);
  }
  error_location_suffix(std::__cxx11::string_const&,unsigned_long)::$_0::operator()[abi_cxx11_
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<((ostream *)local_240,local_280);
  std::operator<<((ostream *)this,"\n");
  std::__cxx11::string::~string(local_280);
  __c = (char)(local_80 - 1 >> 0x38);
  __n = &local_2a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(size_type)__n,__c,in_stack_fffffffffffffcb8);
  poVar3 = std::operator<<((ostream *)local_240,local_2a0);
  std::operator<<(poVar3,"^\n");
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  if (local_40 < local_60) {
    error_location_suffix(std::__cxx11::string_const&,unsigned_long)::$_0::operator()[abi_cxx11_
              (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    poVar3 = std::operator<<((ostream *)local_240,local_2c8);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_2c8);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_240);
  return in_RDI;
}

Assistant:

static std::string error_location_suffix(const std::string & source, size_t pos) {
  auto get_line = [&](size_t line) {
    auto start = source.begin();
    for (size_t i = 1; i < line; ++i) {
      start = std::find(start, source.end(), '\n') + 1;
    }
    auto end = std::find(start, source.end(), '\n');
    return std::string(start, end);
  };
  auto start = source.begin();
  auto end = source.end();
  auto it = start + pos;
  auto line = std::count(start, it, '\n') + 1;
  auto max_line = std::count(start, end, '\n') + 1;
  auto col = pos - std::string(start, it).rfind('\n');
  std::ostringstream out;
  out << " at row " << line << ", column " << col << ":\n";
  if (line > 1) out << get_line(line - 1) << "\n";
  out << get_line(line) << "\n";
  out << std::string(col - 1, ' ') << "^\n";
  if (line < max_line) out << get_line(line + 1) << "\n";

  return out.str();
}